

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoQuad>::CalcStiffT<std::complex<double>>
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoQuad> *this,
          TPZElementMatrixT<std::complex<double>_> *ek,TPZElementMatrixT<std::complex<double>_> *ef)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  ostream *poVar4;
  TPZManVector<TPZMaterialDataT<std::complex<double>_>,_6> *this_00;
  int64_t iVar5;
  TPZCompElSide *pTVar6;
  TPZCompEl *pTVar7;
  int64_t iVar8;
  TPZMaterialDataT<std::complex<double>_> *pTVar9;
  int *piVar10;
  TPZFMatrix<double> *this_01;
  undefined4 extraout_var;
  TPZIntPoints *pTVar11;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  TPZInterpolationSpace *msp_1;
  int i;
  int int_ind;
  REAL detJac;
  TPZFMatrix<double> jacInv;
  TPZFMatrix<double> axe;
  TPZFMatrix<double> jac;
  int intrulepoints;
  TPZManVector<int,_4> intorder;
  TPZGeoEl *ref;
  int order;
  int svec;
  TPZInterpolationSpace *msp;
  int64_t iref;
  TPZManVector<int,_4> ordervec;
  REAL weight;
  TPZManVector<double,_4> intpointtemp;
  TPZAutoPointer<TPZIntPoints> intrule;
  int dim;
  TPZManVector<TPZTransform<double>,_10> trvec;
  int64_t nref;
  TPZManVector<TPZMaterialDataT<std::complex<double>_>,_6> datavec;
  TPZNullMaterialCS<std::complex<double>_> *nullmat;
  TPZMatCombinedSpacesT<std::complex<double>_> *matCombined;
  TPZMaterial *material;
  TPZVec<TPZMaterialDataT<std::complex<double>_>_> *in_stack_fffffffffffbf9d8;
  undefined4 in_stack_fffffffffffbf9e0;
  MType in_stack_fffffffffffbf9e4;
  TPZCompMesh *in_stack_fffffffffffbf9e8;
  TPZManVector<TPZMaterialDataT<std::complex<double>_>,_6> *in_stack_fffffffffffbf9f0;
  TPZIntPoints *in_stack_fffffffffffbf9f8;
  undefined4 in_stack_fffffffffffbfa00;
  undefined4 in_stack_fffffffffffbfa04;
  int64_t in_stack_fffffffffffbfa08;
  TPZManVector<double,_4> *in_stack_fffffffffffbfa10;
  long *plStack_405a0;
  TPZVec<TPZMaterialDataT<std::complex<double>_>_> *size;
  int iStack_40550;
  MType MStack_4054c;
  double dStack_40548;
  TPZFMatrix<double> *in_stack_fffffffffffbfad8;
  REAL *in_stack_fffffffffffbfae0;
  TPZFMatrix<double> *in_stack_fffffffffffbfae8;
  TPZFMatrix<double> *in_stack_fffffffffffbfaf0;
  TPZVec<double> *in_stack_fffffffffffbfaf8;
  TPZGeoEl *in_stack_fffffffffffbfb00;
  undefined1 auStack_40388 [48];
  TPZFMatrix<double> *pTStack_40358;
  uint uStack_40350;
  int iStack_4034c;
  long *plStack_40348;
  int64_t iStack_40340;
  TPZVec<int> TStack_40338;
  double adStack_40308 [2];
  undefined1 auStack_402f8 [64];
  TPZAutoPointer<TPZIntPoints> TStack_402b8;
  undefined4 uStack_402ac;
  undefined1 auStack_402a8 [160];
  size_t in_stack_fffffffffffbfdf8;
  char *in_stack_fffffffffffbfe00;
  TPZVec<TPZMaterialDataT<std::complex<double>_>_> aTStack_3f230 [8081];
  
  lVar2 = (**(code **)(*in_RDI + 0xb8))();
  if ((lVar2 == 0) ||
     (plVar3 = (long *)__dynamic_cast(lVar2,&TPZMaterial::typeinfo,
                                      &TPZMatCombinedSpacesT<std::complex<double>>::typeinfo,
                                      0xfffffffffffffffe), plVar3 == (long *)0x0)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error at ");
    poVar4 = std::operator<<(poVar4,
                             "void TPZMultiphysicsCompEl<pzgeom::TPZGeoQuad>::CalcStiffT(TPZElementMatrixT<TVar> &, TPZElementMatrixT<TVar> &) [TGeometry = pzgeom::TPZGeoQuad, TVar = std::complex<double>]"
                            );
    std::operator<<(poVar4," this->Material() == NULL\n");
    TPZElementMatrixT<std::complex<double>_>::Reset
              ((TPZElementMatrixT<std::complex<double>_> *)in_stack_fffffffffffbf9f0,
               in_stack_fffffffffffbf9e8,in_stack_fffffffffffbf9e4);
    TPZElementMatrixT<std::complex<double>_>::Reset
              ((TPZElementMatrixT<std::complex<double>_> *)in_stack_fffffffffffbf9f0,
               in_stack_fffffffffffbf9e8,in_stack_fffffffffffbf9e4);
  }
  else {
    if (lVar2 == 0) {
      this_00 = (TPZManVector<TPZMaterialDataT<std::complex<double>_>,_6> *)0x0;
    }
    else {
      this_00 = (TPZManVector<TPZMaterialDataT<std::complex<double>_>,_6> *)
                __dynamic_cast(lVar2,&TPZMaterial::typeinfo,
                               &TPZNullMaterialCS<std::complex<double>>::typeinfo,0);
    }
    if (this_00 == (TPZManVector<TPZMaterialDataT<std::complex<double>_>,_6> *)0x0) {
      (**(code **)(*in_RDI + 0xf8))(in_RDI,in_RSI,in_RDX);
      iVar1 = (**(code **)(*in_RDI + 0x90))();
      if (iVar1 != 0) {
        size = aTStack_3f230;
        TPZManVector<TPZMaterialDataT<std::complex<double>_>,_6>::TPZManVector
                  (this_00,(int64_t)size);
        iVar5 = TPZVec<TPZCompElSide>::size((TPZVec<TPZCompElSide> *)(in_RDI + 0xf));
        TPZVec<TPZMaterialDataT<std::complex<double>_>_>::resize
                  ((TPZVec<TPZMaterialDataT<std::complex<double>_>_> *)
                   CONCAT44(in_stack_fffffffffffbf9e4,in_stack_fffffffffffbf9e0),
                   (int64_t)in_stack_fffffffffffbf9d8);
        (**(code **)(*in_RDI + 0x290))(in_RDI,aTStack_3f230,0);
        TPZManVector<TPZTransform<double>,_10>::TPZManVector
                  ((TPZManVector<TPZTransform<double>,_10> *)this_00,(int64_t)size);
        (**(code **)(*in_RDI + 0x280))(in_RDI,auStack_402a8);
        uStack_402ac = (**(code **)(*in_RDI + 0xb0))();
        TPZAutoPointer<TPZIntPoints>::TPZAutoPointer
                  ((TPZAutoPointer<TPZIntPoints> *)in_stack_fffffffffffbf9f0);
        adStack_40308[1] = 0.0;
        TPZManVector<double,_4>::TPZManVector
                  (in_stack_fffffffffffbfa10,in_stack_fffffffffffbfa08,
                   (double *)CONCAT44(in_stack_fffffffffffbfa04,in_stack_fffffffffffbfa00));
        adStack_40308[0] = 0.0;
        TPZManVector<int,_4>::TPZManVector
                  ((TPZManVector<int,_4> *)
                   CONCAT44(in_stack_fffffffffffbfa04,in_stack_fffffffffffbfa00),
                   (int64_t)in_stack_fffffffffffbf9f8);
        for (iStack_40340 = 0; iStack_40340 < iVar5; iStack_40340 = iStack_40340 + 1) {
          pTVar6 = TPZVec<TPZCompElSide>::operator[]
                             ((TPZVec<TPZCompElSide> *)(in_RDI + 0xf),iStack_40340);
          pTVar7 = TPZCompElSide::Element(pTVar6);
          if (pTVar7 == (TPZCompEl *)0x0) {
            plStack_405a0 = (long *)0x0;
          }
          else {
            plStack_405a0 =
                 (long *)__dynamic_cast(pTVar7,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo
                                        ,0);
          }
          plStack_40348 = plStack_405a0;
          if (plStack_405a0 != (long *)0x0) {
            TPZVec<int>::size(&TStack_40338);
            TPZManVector<int,_4>::Resize
                      ((TPZManVector<int,_4> *)in_stack_fffffffffffbfa10,in_stack_fffffffffffbfa08);
            iVar8 = TPZVec<int>::size(&TStack_40338);
            iStack_4034c = (int)iVar8;
            iVar1 = (**(code **)(*plStack_40348 + 0x268))();
            pTVar9 = TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[]
                               (aTStack_3f230,iStack_40340);
            (pTVar9->super_TPZMaterialData).p = iVar1;
            pTVar9 = TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[]
                               (aTStack_3f230,iStack_40340);
            iVar1 = (pTVar9->super_TPZMaterialData).p;
            piVar10 = TPZVec<int>::operator[](&TStack_40338,(long)(iStack_4034c + -1));
            *piVar10 = iVar1;
          }
        }
        uStack_40350 = (**(code **)(*plVar3 + 0x48))(plVar3,&TStack_40338);
        this_01 = (TPZFMatrix<double> *)TPZCompEl::Reference((TPZCompEl *)in_stack_fffffffffffbf9e8)
        ;
        pTStack_40358 = this_01;
        iVar1 = (*(this_01->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x1e])();
        iVar1 = (*(this_01->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0xe])(this_01,(ulong)(iVar1 - 1),(ulong)uStack_40350);
        iVar5 = CONCAT44(extraout_var,iVar1);
        TPZAutoPointer<TPZIntPoints>::operator=
                  ((TPZAutoPointer<TPZIntPoints> *)
                   CONCAT44(in_stack_fffffffffffbfa04,in_stack_fffffffffffbfa00),
                   in_stack_fffffffffffbf9f8);
        TPZManVector<int,_4>::TPZManVector
                  ((TPZManVector<int,_4> *)this_01,iVar5,
                   (int *)CONCAT44(in_stack_fffffffffffbfa04,in_stack_fffffffffffbfa00));
        pTVar11 = TPZAutoPointer<TPZIntPoints>::operator->(&TStack_402b8);
        (*pTVar11->_vptr_TPZIntPoints[5])(pTVar11,auStack_40388,0);
        pTVar11 = TPZAutoPointer<TPZIntPoints>::operator->(&TStack_402b8);
        iVar1 = (*pTVar11->_vptr_TPZIntPoints[3])();
        if (1000 < iVar1) {
          pzinternal::DebugStopImpl(in_stack_fffffffffffbfe00,in_stack_fffffffffffbfdf8);
        }
        TPZFMatrix<double>::TPZFMatrix(this_01);
        TPZFMatrix<double>::TPZFMatrix(this_01);
        TPZFMatrix<double>::TPZFMatrix(this_01);
        for (MStack_4054c = Unknown; (int)MStack_4054c < iVar1; MStack_4054c = MStack_4054c + EF) {
          pTVar11 = TPZAutoPointer<TPZIntPoints>::operator->(&TStack_402b8);
          (*pTVar11->_vptr_TPZIntPoints[4])(pTVar11,(ulong)MStack_4054c,auStack_402f8,adStack_40308)
          ;
          TPZGeoEl::Jacobian(in_stack_fffffffffffbfb00,in_stack_fffffffffffbfaf8,
                             in_stack_fffffffffffbfaf0,in_stack_fffffffffffbfae8,
                             in_stack_fffffffffffbfae0,in_stack_fffffffffffbfad8);
          adStack_40308[0] = ABS(dStack_40548) * adStack_40308[0];
          iStack_40550 = 0;
          while( true ) {
            lVar2 = (long)iStack_40550;
            iVar5 = TPZVec<TPZCompElSide>::size((TPZVec<TPZCompElSide> *)(in_RDI + 0xf));
            if (iVar5 <= lVar2) break;
            pTVar6 = TPZVec<TPZCompElSide>::operator[]
                               ((TPZVec<TPZCompElSide> *)(in_RDI + 0xf),(long)iStack_40550);
            in_stack_fffffffffffbf9f0 =
                 (TPZManVector<TPZMaterialDataT<std::complex<double>_>,_6> *)
                 TPZCompElSide::Element(pTVar6);
            if (in_stack_fffffffffffbf9f0 ==
                (TPZManVector<TPZMaterialDataT<std::complex<double>_>,_6> *)0x0) {
              lVar2 = 0;
            }
            else {
              lVar2 = __dynamic_cast(in_stack_fffffffffffbf9f0,&TPZCompEl::typeinfo,
                                     &TPZInterpolationSpace::typeinfo,0);
            }
            if (lVar2 != 0) {
              in_stack_fffffffffffbf9e4 = MStack_4054c;
              pTVar9 = TPZVec<TPZMaterialDataT<std::complex<double>_>_>::operator[]
                                 (aTStack_3f230,(long)iStack_40550);
              (pTVar9->super_TPZMaterialData).intLocPtIndex = in_stack_fffffffffffbf9e4;
            }
            iStack_40550 = iStack_40550 + 1;
          }
          (**(code **)(*in_RDI + 0x2b0))(in_RDI,auStack_402f8,auStack_402a8,aTStack_3f230);
          (**(code **)(*plVar3 + 0x68))
                    (adStack_40308[0],plVar3,aTStack_3f230,in_RSI + 0x1f0,in_RDX + 0x1f0);
        }
        CleanupMaterialData((TPZMultiphysicsCompEl<pzgeom::TPZGeoQuad> *)
                            CONCAT44(in_stack_fffffffffffbf9e4,in_stack_fffffffffffbf9e0),
                            in_stack_fffffffffffbf9d8);
        TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1b65c94);
        TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1b65ca1);
        TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1b65cae);
        TPZManVector<int,_4>::~TPZManVector
                  ((TPZManVector<int,_4> *)
                   CONCAT44(in_stack_fffffffffffbf9e4,in_stack_fffffffffffbf9e0));
        TPZManVector<int,_4>::~TPZManVector
                  ((TPZManVector<int,_4> *)
                   CONCAT44(in_stack_fffffffffffbf9e4,in_stack_fffffffffffbf9e0));
        TPZManVector<double,_4>::~TPZManVector
                  ((TPZManVector<double,_4> *)
                   CONCAT44(in_stack_fffffffffffbf9e4,in_stack_fffffffffffbf9e0));
        TPZAutoPointer<TPZIntPoints>::~TPZAutoPointer
                  ((TPZAutoPointer<TPZIntPoints> *)
                   CONCAT44(in_stack_fffffffffffbf9e4,in_stack_fffffffffffbf9e0));
        TPZManVector<TPZTransform<double>,_10>::~TPZManVector
                  ((TPZManVector<TPZTransform<double>,_10> *)in_stack_fffffffffffbf9f0);
        TPZManVector<TPZMaterialDataT<std::complex<double>_>,_6>::~TPZManVector
                  (in_stack_fffffffffffbf9f0);
      }
    }
    else {
      TPZElementMatrixT<std::complex<double>_>::Reset
                ((TPZElementMatrixT<std::complex<double>_> *)in_stack_fffffffffffbf9f0,
                 in_stack_fffffffffffbf9e8,in_stack_fffffffffffbf9e4);
      TPZElementMatrixT<std::complex<double>_>::Reset
                ((TPZElementMatrixT<std::complex<double>_> *)in_stack_fffffffffffbf9f0,
                 in_stack_fffffffffffbf9e8,in_stack_fffffffffffbf9e4);
      *(undefined4 *)(in_RSI + 8) = 2;
      *(undefined4 *)(in_RDX + 8) = 1;
    }
  }
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::CalcStiffT(TPZElementMatrixT<TVar> &ek, TPZElementMatrixT<TVar> &ef)
{
    TPZMaterial * material = Material();
    auto *matCombined =
       dynamic_cast<TPZMatCombinedSpacesT<TVar>*>(material);
    if(!material || !matCombined){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        ek.Reset();
        ef.Reset();
        return;
    }
    
    auto *nullmat = dynamic_cast<TPZNullMaterialCS<TVar> *>(material);
    if(nullmat)
    {
        ek.Reset();
        ef.Reset();
        ek.fType = TPZElementMatrix::EK;
        ef.fType = TPZElementMatrix::EF;
        return;
    }
    InitializeElementMatrix(ek,ef);
    
    if (this->NConnects() == 0) return;//boundary discontinuous elements have this characteristic
    
    TPZManVector<TPZMaterialDataT<TVar>,6> datavec;
    const int64_t nref = fElementVec.size();
    datavec.resize(nref);
    InitMaterialData(datavec);
    
    TPZManVector<TPZTransform<> > trvec;
    AffineTransform(trvec);
    
    int dim = Dimension();
    TPZAutoPointer<TPZIntPoints> intrule;
    
    TPZManVector<REAL,4> intpointtemp(TGeometry::Dimension,0.);
    REAL weight = 0.;
    
    TPZManVector<int,4> ordervec;
    //ordervec.resize(nref);
    for (int64_t iref=0;  iref<nref; iref++)
    {
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        int svec;
        if(msp)
        {
            ordervec.Resize(ordervec.size()+1);
            svec = ordervec.size();
        }
        else
        {
            continue;
        }
        datavec[iref].p = msp->MaxOrder();
        ordervec[svec-1] = datavec[iref].p;
    }
    
    int order = matCombined->IntegrationRuleOrder(ordervec);
    
    TPZGeoEl *ref = this->Reference();
    intrule = ref->CreateSideIntegrationRule(ref->NSides()-1, order);
    
    TPZManVector<int,4> intorder(dim,order);
    intrule->SetOrder(intorder);
    int intrulepoints = intrule->NPoints();
    if(intrulepoints > 1000) {
        DebugStop();
    }
    
    TPZFMatrix<REAL> jac, axe, jacInv;
    REAL detJac;
    for(int int_ind = 0; int_ind < intrulepoints; ++int_ind)
    {
        intrule->Point(int_ind,intpointtemp,weight);
        ref->Jacobian(intpointtemp, jac, axe, detJac , jacInv);
        weight *= fabs(detJac);
        for (int i = 0; i < fElementVec.size(); i++) {
            TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[i].Element());
            if (!msp) {
                continue;
            }
            datavec[i].intLocPtIndex = int_ind;
        }
        
        this->ComputeRequiredData(intpointtemp,trvec,datavec);
        
        matCombined->Contribute(datavec,weight,ek.fMat,ef.fMat);
    }//loop over integration points
    
    CleanupMaterialData(datavec);
}